

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode
          (TreeEnsembleParameters_TreeNode *this)

{
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__TreeEnsembleParameters_TreeNode_003dbb48;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->evaluationinfo_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->evaluationinfo_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->evaluationinfo_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->evaluationinfo_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (TreeEnsembleParameters_TreeNode *)&_TreeEnsembleParameters_TreeNode_default_instance_
     ) {
    protobuf_TreeEnsemble_2eproto::InitDefaults();
  }
  this->falsechildnodeid_ = 0;
  this->relativehitrate_ = 0.0;
  this->branchfeaturevalue_ = 0.0;
  this->truechildnodeid_ = 0;
  this->nodebehavior_ = 0;
  this->missingvaluetrackstruechild_ = false;
  *(undefined3 *)&this->field_0x3d = 0;
  this->branchfeatureindex_ = 0;
  this->treeid_ = 0;
  this->nodeid_ = 0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_TreeEnsemble_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.TreeEnsembleParameters.TreeNode)
}